

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::RemoveDefineFlag(cmMakefile *this,char *flag)

{
  bool bVar1;
  size_t len;
  cmMakefile *pcVar2;
  allocator local_49;
  
  pcVar2 = (cmMakefile *)flag;
  len = strlen(flag);
  if (len != 0) {
    RemoveDefineFlag(pcVar2,flag,len,&this->DefineFlagsOrig);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,flag,&local_49);
    bVar1 = ParseDefineFlag(this,(string *)&stack0xffffffffffffffb8,true);
    pcVar2 = (cmMakefile *)&stack0xffffffffffffffb8;
    std::__cxx11::string::~string((string *)pcVar2);
    if (!bVar1) {
      RemoveDefineFlag(pcVar2,flag,len,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefineFlag(const char* flag)
{
  // Check the length of the flag to remove.
  std::string::size_type len = strlen(flag);
  if(len < 1)
    {
    return;
    }

  // Update the string used for the old DEFINITIONS property.
  this->RemoveDefineFlag(flag, len, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if(this->ParseDefineFlag(flag, true))
    {
    return;
    }

  // Remove this flag that does not look like a definition.
  this->RemoveDefineFlag(flag, len, this->DefineFlags);
}